

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O0

void __thiscall soplex::NameSet::memPack(NameSet *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  DataKey this_00;
  DataKey h;
  NameSet *in_RDI;
  char *t;
  int i;
  int newlast;
  char *newmem;
  NameSet *this_01;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffdc;
  char **in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  
  local_14 = 0;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::clear(in_stack_ffffffffffffffb0);
  memSize(in_RDI);
  spx_alloc<char*>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  local_18 = 0;
  while( true ) {
    iVar1 = num((NameSet *)0x19da1d);
    if (iVar1 <= local_18) break;
    pcVar3 = in_RDI->mem;
    piVar2 = DataSet<int>::operator[](&in_RDI->set,local_18);
    pcVar3 = pcVar3 + *piVar2;
    spxSnprintf((char *)(long)local_14,0x400,"%s",pcVar3);
    piVar2 = DataSet<int>::operator[](&in_RDI->set,local_18);
    *piVar2 = local_14;
    sVar4 = strlen(pcVar3);
    local_14 = (int)sVar4 + 1 + local_14;
    local_18 = local_18 + 1;
  }
  memcpy(in_RDI->mem,(void *)0x0,(long)local_14);
  in_RDI->memused = local_14;
  spx_free<char*>((char **)0x19dae9);
  local_18 = 0;
  while( true ) {
    iVar1 = num((NameSet *)0x19db03);
    if (iVar1 <= local_18) break;
    this_01 = (NameSet *)in_RDI->mem;
    this_00 = key(this_01,0);
    piVar2 = DataSet<int>::operator[](&in_RDI->set,(DataKey *)&stack0xffffffffffffffd0);
    Name::Name((Name *)&stack0xffffffffffffffd8,
               (char *)((long)(this_01->hashtab).primes + (long)*piVar2 + -0x60));
    h = key(this_01,0);
    DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add
              ((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)this_00,(Name *)h,
               (DataKey *)in_RDI);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void NameSet::memPack()
{
   char* newmem = nullptr;
   int   newlast = 0;
   int   i;

   hashtab.clear();

   spx_alloc(newmem, memSize());

   for(i = 0; i < num(); i++)
   {
      const char* t = &mem[set[i]];
      spxSnprintf(&newmem[newlast], SPX_MAXSTRLEN, "%s", t);
      set[i] = newlast;
      newlast += int(strlen(t)) + 1;
   }

   memcpy(mem, newmem, static_cast<size_t>(newlast));
   memused = newlast;

   assert(memSize() <= memMax());

   spx_free(newmem);

   for(i = 0; i < num(); i++)
      hashtab.add(Name(&mem[set[key(i)]]), key(i));
}